

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O0

int ly_utf8_less(char *input,int bytes,...)

{
  uint *local_110;
  uint local_f8 [47];
  int local_3c;
  int byte;
  int i;
  va_list ap;
  int bytes_local;
  char *input_local;
  
  ap[0]._0_8_ = &stack0x00000008;
  byte = 0x10;
  local_3c = 0;
  while( true ) {
    if (bytes <= local_3c) {
      return 0;
    }
    if ((uint)byte < 0x29) {
      local_110 = (uint *)((long)local_f8 + (long)byte);
      byte = byte + 8;
    }
    else {
      local_110 = (uint *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    if ((*local_110 & 0xff) < (uint)(byte)input[local_3c]) break;
    if ((uint)(byte)input[local_3c] < (*local_110 & 0xff)) {
      return 1;
    }
    local_3c = local_3c + 1;
  }
  return 0;
}

Assistant:

static int
ly_utf8_less(const char *input, int bytes, ...)
{
    va_list ap;
    int i, byte;

    va_start(ap, bytes);
    for (i = 0; i < bytes; ++i) {
        byte = va_arg(ap, int);

        /* compare until bytes differ */
        if ((uint8_t)input[i] > (uint8_t)byte) {
            return 0;
        } else if ((uint8_t)input[i] < (uint8_t)byte) {
            return 1;
        }
    }
    va_end(ap);

    /* equals */
    return 0;
}